

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

u_char * ngx_sprintf_num(u_char *buf,u_char *last,uint64_t ui64,u_char zero,ngx_uint_t hexadecimal,
                        ngx_uint_t width)

{
  uint uVar1;
  u_char *puVar2;
  size_t __n;
  ulong uVar3;
  u_char *puVar4;
  bool bVar5;
  undefined1 local_48 [8];
  u_char temp [21];
  
  puVar2 = temp + 0xc;
  puVar4 = puVar2;
  if (hexadecimal == 0) {
    if (ui64 >> 0x20 == 0) {
      do {
        uVar1 = (uint)ui64;
        puVar4[-1] = (char)ui64 + (char)((ui64 & 0xffffffff) / 10) * -10 | 0x30;
        puVar4 = puVar4 + -1;
        ui64 = (ui64 & 0xffffffff) / 10;
      } while (9 < uVar1);
    }
    else {
      do {
        puVar4[-1] = (char)ui64 + (char)(ui64 / 10) * -10 | 0x30;
        puVar4 = puVar4 + -1;
        bVar5 = 9 < ui64;
        ui64 = ui64 / 10;
      } while (bVar5);
    }
  }
  else if (hexadecimal == 1) {
    do {
      puVar4[-1] = "0123456789abcdef"[(uint)ui64 & 0xf];
      puVar4 = puVar4 + -1;
      bVar5 = 0xf < ui64;
      ui64 = ui64 >> 4;
    } while (bVar5);
  }
  else {
    do {
      puVar4[-1] = "0123456789ABCDEF"[(uint)ui64 & 0xf];
      puVar4 = puVar4 + -1;
      bVar5 = 0xf < ui64;
      ui64 = ui64 >> 4;
    } while (bVar5);
  }
  uVar3 = (long)puVar2 - (long)puVar4;
  if (buf < last && uVar3 < width) {
    puVar2 = last + ~(ulong)buf;
    if (puVar4 + (width - (long)local_48) + -0x15 < last + ~(ulong)buf) {
      puVar2 = puVar4 + (width - (long)local_48) + -0x15;
    }
    memset(buf,(uint)zero,(size_t)(puVar2 + 1));
    buf = buf + (long)puVar2 + 1;
  }
  __n = (long)last - (long)buf;
  if (buf + uVar3 <= last) {
    __n = uVar3;
  }
  memcpy(buf,puVar4,__n);
  return buf + __n;
}

Assistant:

static u_char *
ngx_sprintf_num(u_char *buf, u_char *last, uint64_t ui64, u_char zero,
    ngx_uint_t hexadecimal, ngx_uint_t width)
{
    u_char         *p, temp[NGX_INT64_LEN + 1];
                       /*
                        * we need temp[NGX_INT64_LEN] only,
                        * but icc issues the warning
                        */
    size_t          len;
    uint32_t        ui32;
    static u_char   hex[] = "0123456789abcdef";
    static u_char   HEX[] = "0123456789ABCDEF";

    p = temp + NGX_INT64_LEN;

    if (hexadecimal == 0) {

        if (ui64 <= (uint64_t) NGX_MAX_UINT32_VALUE) {

            /*
             * To divide 64-bit numbers and to find remainders
             * on the x86 platform gcc and icc call the libc functions
             * [u]divdi3() and [u]moddi3(), they call another function
             * in its turn.  On FreeBSD it is the qdivrem() function,
             * its source code is about 170 lines of the code.
             * The glibc counterpart is about 150 lines of the code.
             *
             * For 32-bit numbers and some divisors gcc and icc use
             * a inlined multiplication and shifts.  For example,
             * unsigned "i32 / 10" is compiled to
             *
             *     (i32 * 0xCCCCCCCD) >> 35
             */

            ui32 = (uint32_t) ui64;

            do {
                *--p = (u_char) (ui32 % 10 + '0');
            } while (ui32 /= 10);

        } else {
            do {
                *--p = (u_char) (ui64 % 10 + '0');
            } while (ui64 /= 10);
        }

    } else if (hexadecimal == 1) {

        do {

            /* the "(uint32_t)" cast disables the BCC's warning */
            *--p = hex[(uint32_t) (ui64 & 0xf)];

        } while (ui64 >>= 4);

    } else { /* hexadecimal == 2 */

        do {

            /* the "(uint32_t)" cast disables the BCC's warning */
            *--p = HEX[(uint32_t) (ui64 & 0xf)];

        } while (ui64 >>= 4);
    }

    /* zero or space padding */

    len = (temp + NGX_INT64_LEN) - p;

    while (len++ < width && buf < last) {
        *buf++ = zero;
    }

    /* number safe copy */

    len = (temp + NGX_INT64_LEN) - p;

    if (buf + len > last) {
        len = last - buf;
    }

    return ngx_cpymem(buf, p, len);
}